

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint.cpp
# Opt level: O0

uint8_t * Fossilize::encode_varint(uint8_t *buffer,uint32_t *words,size_t word_count)

{
  uint uVar1;
  byte bVar2;
  byte *pbVar3;
  uint32_t *puVar4;
  ulong uStack_28;
  uint32_t w;
  size_t i;
  size_t word_count_local;
  uint32_t *words_local;
  uint8_t *buffer_local;
  
  words_local = (uint32_t *)buffer;
  for (uStack_28 = 0; uStack_28 < word_count; uStack_28 = uStack_28 + 1) {
    uVar1 = words[uStack_28];
    bVar2 = (byte)uVar1;
    if (uVar1 < 0x80) {
      *(byte *)words_local = bVar2;
      words_local = (uint32_t *)((long)words_local + 1);
    }
    else if (uVar1 < 0x4000) {
      pbVar3 = (byte *)((long)words_local + 1);
      *(byte *)words_local = bVar2 & 0x7f | 0x80;
      words_local = (uint32_t *)((long)words_local + 2);
      *pbVar3 = (byte)(uVar1 >> 7) & 0x7f;
    }
    else if (uVar1 < 0x200000) {
      *(byte *)words_local = bVar2 & 0x7f | 0x80;
      pbVar3 = (byte *)((long)words_local + 2);
      *(byte *)((long)words_local + 1) = (byte)(uVar1 >> 7) & 0x7f | 0x80;
      words_local = (uint32_t *)((long)words_local + 3);
      *pbVar3 = (byte)(uVar1 >> 0xe) & 0x7f;
    }
    else if (uVar1 < 0x10000000) {
      *(byte *)words_local = bVar2 & 0x7f | 0x80;
      *(byte *)((long)words_local + 1) = (byte)(uVar1 >> 7) & 0x7f | 0x80;
      pbVar3 = (byte *)((long)words_local + 3);
      *(byte *)((long)words_local + 2) = (byte)(uVar1 >> 0xe) & 0x7f | 0x80;
      words_local = words_local + 1;
      *pbVar3 = (byte)(uVar1 >> 0x15) & 0x7f;
    }
    else {
      *(byte *)words_local = bVar2 & 0x7f | 0x80;
      *(byte *)((long)words_local + 1) = (byte)(uVar1 >> 7) & 0x7f | 0x80;
      *(byte *)((long)words_local + 2) = (byte)(uVar1 >> 0xe) & 0x7f | 0x80;
      puVar4 = words_local + 1;
      *(byte *)((long)words_local + 3) = (byte)(uVar1 >> 0x15) & 0x7f | 0x80;
      words_local = (uint32_t *)((long)words_local + 5);
      *(byte *)puVar4 = (byte)(uVar1 >> 0x1c);
    }
  }
  return (uint8_t *)words_local;
}

Assistant:

uint8_t *encode_varint(uint8_t *buffer, const uint32_t *words, size_t word_count)
{
	for (size_t i = 0; i < word_count; i++)
	{
		auto w = words[i];
		if (w < (1u << 7))
			*buffer++ = uint8_t(w);
		else if (w < (1u << 14))
		{
			*buffer++ = uint8_t(0x80u | ((w >> 0) & 0x7f));
			*buffer++ = uint8_t((w >> 7) & 0x7f);
		}
		else if (w < (1u << 21))
		{
			*buffer++ = uint8_t(0x80u | ((w >> 0) & 0x7f));
			*buffer++ = uint8_t(0x80u | ((w >> 7) & 0x7f));
			*buffer++ = uint8_t((w >> 14) & 0x7f);
		}
		else if (w < (1u << 28))
		{
			*buffer++ = uint8_t(0x80u | ((w >> 0) & 0x7f));
			*buffer++ = uint8_t(0x80u | ((w >> 7) & 0x7f));
			*buffer++ = uint8_t(0x80u | ((w >> 14) & 0x7f));
			*buffer++ = uint8_t((w >> 21) & 0x7f);
		}
		else
		{
			*buffer++ = uint8_t(0x80u | ((w >> 0) & 0x7f));
			*buffer++ = uint8_t(0x80u | ((w >> 7) & 0x7f));
			*buffer++ = uint8_t(0x80u | ((w >> 14) & 0x7f));
			*buffer++ = uint8_t(0x80u | ((w >> 21) & 0x7f));
			*buffer++ = uint8_t((w >> 28) & 0x7f);
		}
	}
	return buffer;
}